

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# StrWriter_cpp.h
# Opt level: O1

StrWriter * __thiscall moira::StrWriter::operator<<(StrWriter *this,Scale s)

{
  Syntax SVar1;
  char *pcVar2;
  
  if ((s.raw != 0) && (SVar1 = this->style->syntax, SVar1 < (MUSASHI|MOIRA_MIT))) {
    pcVar2 = this->ptr;
    this->ptr = pcVar2 + 1;
    *pcVar2 = (char)(0x2a3a2a3a2a >> ((byte)(SVar1 << 3) & 0x3f));
    pcVar2 = this->ptr;
    this->ptr = pcVar2 + 1;
    *pcVar2 = (char)(1 << ((byte)s.raw & 0x1f)) + '0';
  }
  return this;
}

Assistant:

StrWriter&
StrWriter::operator<<(Scale s)
{
    if (!s.raw) return *this;

    switch (style.syntax) {

        case Syntax::MOIRA:
        case Syntax::MUSASHI:
       case Syntax::GNU:

            *ptr++ = '*';
            *ptr++ = '0' + (char)(1 << s.raw);
            break;

        case Syntax::GNU_MIT:
        case Syntax::MOIRA_MIT:

            *ptr++ = ':';
            *ptr++ = '0' + (char)(1 << s.raw);
            break;
    }

    return *this;
}